

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bilinear_pack8.h
# Opt level: O0

void ncnn::resize_bilinear_image_pack8
               (Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 *puVar28;
  int iVar29;
  long in_RCX;
  uint *in_RDX;
  long *in_RSI;
  long *in_RDI;
  uint *in_R8;
  long in_R9;
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  __m256 _D;
  __m256 _rows1_2;
  __m256 _rows0_1;
  int dx_2;
  float *Dp;
  float *rows1p;
  float *rows0p;
  __m256 _b1;
  __m256 _b0;
  __m256 _rows1_1;
  __m256 _rows0;
  __m256 _S11_1;
  __m256 _S10_1;
  __m256 _S01;
  __m256 _S00;
  __m256 _a1_1;
  __m256 _a0_1;
  float *S1p_1;
  float *S0p;
  int sx_1;
  int dx_1;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_1;
  float *S1_1;
  float *S0;
  __m256 _rows1;
  __m256 _S11;
  __m256 _S10;
  __m256 _a1;
  __m256 _a0;
  float *S1p;
  int sx;
  int dx;
  float *rows1p_1;
  float *alphap;
  float *S1;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows1;
  float *rows0;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff158;
  undefined8 **ppuVar36;
  int in_stack_fffffffffffff164;
  undefined4 in_stack_fffffffffffff168;
  undefined4 in_stack_fffffffffffff16c;
  int in_stack_fffffffffffff174;
  undefined4 in_stack_fffffffffffff178;
  undefined4 in_stack_fffffffffffff17c;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  int local_c1c;
  undefined8 *local_c18;
  undefined8 *local_c10;
  undefined8 *local_c08;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  int local_aac;
  uint *local_a98;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  int local_9bc;
  uint *local_9b0;
  int local_990;
  int local_98c;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 *local_968;
  int *local_960;
  undefined8 local_958;
  undefined4 local_950;
  long *local_948;
  undefined4 local_940;
  undefined4 local_93c;
  undefined4 local_938;
  undefined4 local_934;
  undefined4 local_930;
  undefined8 local_928;
  undefined8 *local_920;
  int *local_918;
  undefined8 local_910;
  undefined4 local_908;
  long *local_900;
  undefined4 local_8f8;
  undefined4 local_8f4;
  undefined4 local_8f0;
  undefined4 local_8ec;
  undefined4 local_8e8;
  undefined8 local_8e0;
  int local_8d8;
  int local_8d4;
  long local_8d0;
  uint *local_8c8;
  long local_8c0;
  uint *local_8b8;
  long *local_8b0;
  long *local_8a8;
  undefined8 *local_8a0;
  undefined8 *local_898;
  undefined8 *local_890;
  undefined8 *local_888;
  undefined8 *local_880;
  undefined8 *local_878;
  undefined8 *local_870;
  undefined8 *local_868;
  undefined8 **local_860;
  undefined8 **local_850;
  int local_83c;
  long *local_838;
  int local_82c;
  long *local_828;
  int local_81c;
  long *local_818;
  int local_80c;
  long *local_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 *local_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 *local_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined8 *local_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 *local_720;
  uint local_718;
  uint local_714;
  uint local_710;
  uint local_70c;
  uint local_708;
  uint local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  int local_370;
  undefined4 local_36c;
  undefined8 **local_368;
  int local_350;
  undefined4 local_34c;
  undefined8 **local_348;
  undefined8 *local_340;
  undefined8 *local_330;
  undefined1 local_320 [32];
  uint local_300;
  uint local_2fc;
  uint local_2f8;
  uint local_2f4;
  uint local_2f0;
  uint local_2ec;
  uint local_2e8;
  uint local_2e4;
  undefined1 local_2e0 [32];
  uint local_2c0;
  uint local_2bc;
  uint local_2b8;
  uint local_2b4;
  uint local_2b0;
  uint local_2ac;
  uint local_2a8;
  uint local_2a4;
  undefined1 local_2a0 [32];
  uint local_280;
  uint local_27c;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  uint local_268;
  uint local_264;
  undefined1 local_260 [32];
  uint local_240;
  uint local_23c;
  uint local_238;
  uint local_234;
  uint local_230;
  uint local_22c;
  uint local_228;
  uint local_224;
  undefined1 local_220 [32];
  uint local_200;
  uint local_1fc;
  uint local_1f8;
  uint local_1f4;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  uint local_1e4;
  undefined1 local_1e0 [32];
  uint local_1c0;
  uint local_1bc;
  uint local_1b8;
  uint local_1b4;
  uint local_1b0;
  uint local_1ac;
  uint local_1a8;
  uint local_1a4;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  float local_180;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float fStack_168;
  float fStack_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  float fStack_124;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  float local_100;
  float fStack_fc;
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  float fStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float fStack_a4;
  undefined8 local_90;
  undefined4 local_84;
  undefined8 local_80;
  int local_74;
  undefined8 **local_70;
  undefined8 local_68;
  undefined4 local_5c;
  undefined8 local_58;
  int local_4c;
  undefined8 **local_48;
  undefined8 **local_40;
  undefined8 **local_38;
  
  local_8d4 = *(int *)((long)in_RSI + 0x2c);
  local_8d8 = (int)in_RSI[6];
  local_70 = &local_920;
  local_80 = 0x20;
  local_84 = 8;
  local_90 = 0;
  local_920 = (undefined8 *)0x0;
  local_918 = (int *)0x0;
  local_910 = 0;
  local_908 = 0;
  local_900 = (long *)0x0;
  local_8f8 = 0;
  local_8f4 = 0;
  local_8f0 = 0;
  local_8ec = 0;
  local_8e8 = 0;
  local_8e0 = 0;
  local_8d0 = in_R9;
  local_8c8 = in_R8;
  local_8c0 = in_RCX;
  local_8b8 = in_RDX;
  local_8b0 = in_RSI;
  local_8a8 = in_RDI;
  local_74 = local_8d4;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
              in_stack_fffffffffffff174,
              CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
              in_stack_fffffffffffff164,in_stack_fffffffffffff158);
  local_48 = &local_968;
  local_4c = local_8d4;
  local_58 = 0x20;
  local_5c = 8;
  local_68 = 0;
  local_968 = (undefined8 *)0x0;
  local_960 = (int *)0x0;
  local_958 = 0;
  local_950 = 0;
  local_948 = (long *)0x0;
  local_940 = 0;
  local_93c = 0;
  local_938 = 0;
  local_934 = 0;
  local_930 = 0;
  local_928 = 0;
  Mat::create((Mat *)CONCAT44(in_stack_fffffffffffff17c,in_stack_fffffffffffff178),
              in_stack_fffffffffffff174,
              CONCAT44(in_stack_fffffffffffff16c,in_stack_fffffffffffff168),
              in_stack_fffffffffffff164,in_stack_fffffffffffff158);
  local_38 = &local_920;
  local_980 = local_920;
  local_40 = &local_968;
  local_988 = local_968;
  local_98c = -2;
  for (local_990 = 0; puVar28 = local_980, local_990 < local_8d8; local_990 = local_990 + 1) {
    iVar1 = *(int *)(local_8d0 + (long)local_990 * 4);
    if (iVar1 != local_98c) {
      if (iVar1 == local_98c + 1) {
        local_980 = local_988;
        local_988 = puVar28;
        local_81c = iVar1 + 1;
        local_818 = local_8a8;
        lVar4 = *local_8a8;
        iVar2 = *(int *)((long)local_8a8 + 0x2c);
        lVar5 = local_8a8[2];
        local_9b0 = local_8b8;
        for (local_9bc = 0; local_9bc < local_8d4; local_9bc = local_9bc + 1) {
          local_868 = (undefined8 *)
                      (lVar4 + (long)iVar2 * (long)local_81c * lVar5 +
                      (long)(*(int *)(local_8c0 + (long)local_9bc * 4) << 3) * 4);
          local_704 = *local_9b0;
          auVar8 = vinsertps_avx(ZEXT416(local_704),ZEXT416(local_704),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_704),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_704),0x30);
          auVar9 = vinsertps_avx(ZEXT416(local_704),ZEXT416(local_704),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(local_704),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(local_704),0x30);
          auVar30._16_16_ = auVar8;
          auVar30._0_16_ = auVar9;
          local_320._0_8_ = auVar9._0_8_;
          local_320._8_8_ = auVar9._8_8_;
          local_320._16_8_ = auVar8._0_8_;
          local_320._24_8_ = auVar8._8_8_;
          local_708 = local_9b0[1];
          auVar10 = vinsertps_avx(ZEXT416(local_708),ZEXT416(local_708),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_708),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_708),0x30);
          auVar11 = vinsertps_avx(ZEXT416(local_708),ZEXT416(local_708),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_708),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_708),0x30);
          auVar31._16_16_ = auVar10;
          auVar31._0_16_ = auVar11;
          local_2e0._0_8_ = auVar11._0_8_;
          local_2e0._8_8_ = auVar11._8_8_;
          local_2e0._16_8_ = auVar10._0_8_;
          local_2e0._24_8_ = auVar10._8_8_;
          uVar12 = *local_868;
          uVar13 = local_868[1];
          uVar14 = local_868[2];
          uVar15 = local_868[3];
          local_870 = local_868 + 4;
          uVar16 = *local_870;
          uVar17 = local_868[5];
          uVar18 = local_868[6];
          uVar19 = local_868[7];
          local_620._0_4_ = (float)uVar12;
          local_620._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_618._0_4_ = (float)uVar13;
          uStack_618._4_4_ = (float)((ulong)uVar13 >> 0x20);
          uStack_610._0_4_ = (float)uVar14;
          uStack_610._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_608._0_4_ = (float)uVar15;
          uStack_608._4_4_ = (float)((ulong)uVar15 >> 0x20);
          local_640._0_4_ = auVar9._0_4_;
          local_640._4_4_ = auVar9._4_4_;
          uStack_638._0_4_ = auVar9._8_4_;
          uStack_638._4_4_ = auVar9._12_4_;
          uStack_630._0_4_ = auVar8._0_4_;
          uStack_630._4_4_ = auVar8._4_4_;
          uStack_628._0_4_ = auVar8._8_4_;
          local_a80 = CONCAT44(local_620._4_4_ * local_640._4_4_,(float)local_620 * (float)local_640
                              );
          uStack_a78 = CONCAT44(uStack_618._4_4_ * uStack_638._4_4_,
                                (float)uStack_618 * (float)uStack_638);
          uStack_a70 = CONCAT44(uStack_610._4_4_ * uStack_630._4_4_,
                                (float)uStack_610 * (float)uStack_630);
          uStack_a68 = CONCAT44(uStack_608._4_4_,(float)uStack_608 * (float)uStack_628);
          local_400 = local_2e0._0_8_;
          uStack_3f8 = local_2e0._8_8_;
          uStack_3f0 = local_2e0._16_8_;
          uStack_3e8 = local_2e0._24_8_;
          local_420 = local_a80;
          uStack_418 = uStack_a78;
          uStack_410 = uStack_a70;
          uStack_408 = uStack_a68;
          local_3e0._0_4_ = (float)uVar16;
          local_3a0 = (float)local_3e0;
          local_3e0._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_39c = local_3e0._4_4_;
          uStack_3d8._0_4_ = (float)uVar17;
          fStack_398 = (float)uStack_3d8;
          uStack_3d8._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_394 = uStack_3d8._4_4_;
          uStack_3d0._0_4_ = (float)uVar18;
          fStack_390 = (float)uStack_3d0;
          uStack_3d0._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_38c = uStack_3d0._4_4_;
          uStack_3c8._0_4_ = (float)uVar19;
          fStack_388 = (float)uStack_3c8;
          uStack_3c8._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_384 = uStack_3c8._4_4_;
          local_3c0._0_4_ = auVar11._0_4_;
          local_3c0._4_4_ = auVar11._4_4_;
          uStack_3b8._0_4_ = auVar11._8_4_;
          uStack_3b8._4_4_ = auVar11._12_4_;
          uStack_3b0._0_4_ = auVar10._0_4_;
          uStack_3b0._4_4_ = auVar10._4_4_;
          uStack_3a8._0_4_ = auVar10._8_4_;
          local_180 = (float)local_3e0 * (float)local_3c0;
          fStack_17c = local_3e0._4_4_ * local_3c0._4_4_;
          fStack_178 = (float)uStack_3d8 * (float)uStack_3b8;
          fStack_174 = uStack_3d8._4_4_ * uStack_3b8._4_4_;
          fStack_170 = (float)uStack_3d0 * (float)uStack_3b0;
          fStack_16c = uStack_3d0._4_4_ * uStack_3b0._4_4_;
          fStack_168 = (float)uStack_3c8 * (float)uStack_3a8;
          local_1a0 = local_a80;
          uStack_198 = uStack_a78;
          uStack_190 = uStack_a70;
          uStack_188 = uStack_a68;
          local_740 = CONCAT44(fStack_17c + local_620._4_4_ * local_640._4_4_,
                               local_180 + (float)local_620 * (float)local_640);
          uStack_738 = CONCAT44(fStack_174 + uStack_618._4_4_ * uStack_638._4_4_,
                                fStack_178 + (float)uStack_618 * (float)uStack_638);
          uStack_730 = CONCAT44(fStack_16c + uStack_610._4_4_ * uStack_630._4_4_,
                                fStack_170 + (float)uStack_610 * (float)uStack_630);
          uStack_728 = CONCAT44(uStack_3c8._4_4_ + uStack_608._4_4_,
                                fStack_168 + (float)uStack_608 * (float)uStack_628);
          local_720 = (undefined8 *)((long)puVar28 + (long)(local_9bc << 3) * 4);
          *local_720 = local_740;
          local_720[1] = uStack_738;
          local_720[2] = uStack_730;
          local_720[3] = uStack_728;
          local_9b0 = local_9b0 + 2;
          local_640 = local_320._0_8_;
          uStack_638 = local_320._8_8_;
          uStack_630 = local_320._16_8_;
          uStack_628 = local_320._24_8_;
          local_620 = uVar12;
          uStack_618 = uVar13;
          uStack_610 = uVar14;
          uStack_608 = uVar15;
          local_3e0 = uVar16;
          uStack_3d8 = uVar17;
          uStack_3d0 = uVar18;
          uStack_3c8 = uVar19;
          local_3c0 = local_2e0._0_8_;
          uStack_3b8 = local_2e0._8_8_;
          uStack_3b0 = local_2e0._16_8_;
          uStack_3a8 = local_2e0._24_8_;
          local_320 = auVar30;
          local_300 = local_704;
          local_2fc = local_704;
          local_2f8 = local_704;
          local_2f4 = local_704;
          local_2f0 = local_704;
          local_2ec = local_704;
          local_2e8 = local_704;
          local_2e4 = local_704;
          local_2e0 = auVar31;
          local_2c0 = local_708;
          local_2bc = local_708;
          local_2b8 = local_708;
          local_2b4 = local_708;
          local_2b0 = local_708;
          local_2ac = local_708;
          local_2a8 = local_708;
          local_2a4 = local_708;
          fStack_164 = fStack_384;
        }
      }
      else {
        local_828 = local_8a8;
        lVar4 = *local_8a8;
        iVar2 = *(int *)((long)local_8a8 + 0x2c);
        lVar5 = local_8a8[2];
        local_83c = iVar1 + 1;
        local_838 = local_8a8;
        lVar6 = *local_8a8;
        iVar3 = *(int *)((long)local_8a8 + 0x2c);
        lVar7 = local_8a8[2];
        local_a98 = local_8b8;
        for (local_aac = 0; local_82c = iVar1, local_aac < local_8d4; local_aac = local_aac + 1) {
          iVar29 = *(int *)(local_8c0 + (long)local_aac * 4) << 3;
          local_878 = (undefined8 *)(lVar4 + (long)iVar2 * (long)iVar1 * lVar5 + (long)iVar29 * 4);
          local_888 = (undefined8 *)
                      (lVar6 + (long)iVar3 * (long)local_83c * lVar7 + (long)iVar29 * 4);
          local_70c = *local_a98;
          auVar8 = vinsertps_avx(ZEXT416(local_70c),ZEXT416(local_70c),0x10);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_70c),0x20);
          auVar8 = vinsertps_avx(auVar8,ZEXT416(local_70c),0x30);
          auVar9 = vinsertps_avx(ZEXT416(local_70c),ZEXT416(local_70c),0x10);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(local_70c),0x20);
          auVar9 = vinsertps_avx(auVar9,ZEXT416(local_70c),0x30);
          auVar32._16_16_ = auVar8;
          auVar32._0_16_ = auVar9;
          local_2a0._0_8_ = auVar9._0_8_;
          local_2a0._8_8_ = auVar9._8_8_;
          local_2a0._16_8_ = auVar8._0_8_;
          local_2a0._24_8_ = auVar8._8_8_;
          local_710 = local_a98[1];
          auVar10 = vinsertps_avx(ZEXT416(local_710),ZEXT416(local_710),0x10);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_710),0x20);
          auVar10 = vinsertps_avx(auVar10,ZEXT416(local_710),0x30);
          auVar11 = vinsertps_avx(ZEXT416(local_710),ZEXT416(local_710),0x10);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_710),0x20);
          auVar11 = vinsertps_avx(auVar11,ZEXT416(local_710),0x30);
          auVar33._16_16_ = auVar10;
          auVar33._0_16_ = auVar11;
          local_260._0_8_ = auVar11._0_8_;
          local_260._8_8_ = auVar11._8_8_;
          local_260._16_8_ = auVar10._0_8_;
          local_260._24_8_ = auVar10._8_8_;
          uVar12 = *local_878;
          uVar13 = local_878[1];
          uVar14 = local_878[2];
          uVar15 = local_878[3];
          local_880 = local_878 + 4;
          uVar16 = *local_880;
          uVar17 = local_878[5];
          uVar18 = local_878[6];
          uVar19 = local_878[7];
          uVar20 = *local_888;
          uVar21 = local_888[1];
          uVar22 = local_888[2];
          uVar23 = local_888[3];
          local_890 = local_888 + 4;
          uVar24 = *local_890;
          uVar25 = local_888[5];
          uVar26 = local_888[6];
          uVar27 = local_888[7];
          local_660._0_4_ = (float)uVar12;
          local_660._4_4_ = (float)((ulong)uVar12 >> 0x20);
          uStack_658._0_4_ = (float)uVar13;
          uStack_658._4_4_ = (float)((ulong)uVar13 >> 0x20);
          uStack_650._0_4_ = (float)uVar14;
          uStack_650._4_4_ = (float)((ulong)uVar14 >> 0x20);
          uStack_648._0_4_ = (float)uVar15;
          uStack_648._4_4_ = (float)((ulong)uVar15 >> 0x20);
          local_680._0_4_ = auVar9._0_4_;
          local_680._4_4_ = auVar9._4_4_;
          uStack_678._0_4_ = auVar9._8_4_;
          uStack_678._4_4_ = auVar9._12_4_;
          uStack_670._0_4_ = auVar8._0_4_;
          uStack_670._4_4_ = auVar8._4_4_;
          uStack_668._0_4_ = auVar8._8_4_;
          local_ba0 = CONCAT44(local_660._4_4_ * local_680._4_4_,(float)local_660 * (float)local_680
                              );
          uStack_b98 = CONCAT44(uStack_658._4_4_ * uStack_678._4_4_,
                                (float)uStack_658 * (float)uStack_678);
          uStack_b90 = CONCAT44(uStack_650._4_4_ * uStack_670._4_4_,
                                (float)uStack_650 * (float)uStack_670);
          uStack_b88 = CONCAT44(uStack_648._4_4_,(float)uStack_648 * (float)uStack_668);
          local_6c0 = local_2a0._0_8_;
          uStack_6b8 = local_2a0._8_8_;
          uStack_6b0 = local_2a0._16_8_;
          uStack_6a8 = local_2a0._24_8_;
          local_6a0._0_4_ = (float)uVar20;
          local_6a0._4_4_ = (float)((ulong)uVar20 >> 0x20);
          uStack_698._0_4_ = (float)uVar21;
          uStack_698._4_4_ = (float)((ulong)uVar21 >> 0x20);
          uStack_690._0_4_ = (float)uVar22;
          uStack_690._4_4_ = (float)((ulong)uVar22 >> 0x20);
          uStack_688._0_4_ = (float)uVar23;
          uStack_688._4_4_ = (float)((ulong)uVar23 >> 0x20);
          local_bc0 = CONCAT44(local_6a0._4_4_ * local_680._4_4_,(float)local_6a0 * (float)local_680
                              );
          uStack_bb8 = CONCAT44(uStack_698._4_4_ * uStack_678._4_4_,
                                (float)uStack_698 * (float)uStack_678);
          uStack_bb0 = CONCAT44(uStack_690._4_4_ * uStack_670._4_4_,
                                (float)uStack_690 * (float)uStack_670);
          uStack_ba8 = CONCAT44(uStack_688._4_4_,(float)uStack_688 * (float)uStack_668);
          local_4a0 = local_260._0_8_;
          uStack_498 = local_260._8_8_;
          uStack_490 = local_260._16_8_;
          uStack_488 = local_260._24_8_;
          local_4c0 = local_ba0;
          uStack_4b8 = uStack_b98;
          uStack_4b0 = uStack_b90;
          uStack_4a8 = uStack_b88;
          local_480._0_4_ = (float)uVar16;
          local_440 = (float)local_480;
          local_480._4_4_ = (float)((ulong)uVar16 >> 0x20);
          fStack_43c = local_480._4_4_;
          uStack_478._0_4_ = (float)uVar17;
          fStack_438 = (float)uStack_478;
          uStack_478._4_4_ = (float)((ulong)uVar17 >> 0x20);
          fStack_434 = uStack_478._4_4_;
          uStack_470._0_4_ = (float)uVar18;
          fStack_430 = (float)uStack_470;
          uStack_470._4_4_ = (float)((ulong)uVar18 >> 0x20);
          fStack_42c = uStack_470._4_4_;
          uStack_468._0_4_ = (float)uVar19;
          fStack_428 = (float)uStack_468;
          uStack_468._4_4_ = (float)((ulong)uVar19 >> 0x20);
          fStack_424 = uStack_468._4_4_;
          local_460._0_4_ = auVar11._0_4_;
          local_460._4_4_ = auVar11._4_4_;
          uStack_458._0_4_ = auVar11._8_4_;
          uStack_458._4_4_ = auVar11._12_4_;
          uStack_450._0_4_ = auVar10._0_4_;
          uStack_450._4_4_ = auVar10._4_4_;
          uStack_448._0_4_ = auVar10._8_4_;
          local_140 = (float)local_480 * (float)local_460;
          fStack_13c = local_480._4_4_ * local_460._4_4_;
          fStack_138 = (float)uStack_478 * (float)uStack_458;
          fStack_134 = uStack_478._4_4_ * uStack_458._4_4_;
          fStack_130 = (float)uStack_470 * (float)uStack_450;
          fStack_12c = uStack_470._4_4_ * uStack_450._4_4_;
          fStack_128 = (float)uStack_468 * (float)uStack_448;
          local_160 = local_ba0;
          uStack_158 = uStack_b98;
          uStack_150 = uStack_b90;
          uStack_148 = uStack_b88;
          local_780 = CONCAT44(fStack_13c + local_660._4_4_ * local_680._4_4_,
                               local_140 + (float)local_660 * (float)local_680);
          uStack_778 = CONCAT44(fStack_134 + uStack_658._4_4_ * uStack_678._4_4_,
                                fStack_138 + (float)uStack_658 * (float)uStack_678);
          uStack_770 = CONCAT44(fStack_12c + uStack_650._4_4_ * uStack_670._4_4_,
                                fStack_130 + (float)uStack_650 * (float)uStack_670);
          uStack_768 = CONCAT44(uStack_468._4_4_ + uStack_648._4_4_,
                                fStack_128 + (float)uStack_648 * (float)uStack_668);
          local_540 = local_260._0_8_;
          uStack_538 = local_260._8_8_;
          uStack_530 = local_260._16_8_;
          uStack_528 = local_260._24_8_;
          local_560 = local_bc0;
          uStack_558 = uStack_bb8;
          uStack_550 = uStack_bb0;
          uStack_548 = uStack_ba8;
          local_520._0_4_ = (float)uVar24;
          local_4e0 = (float)local_520;
          local_520._4_4_ = (float)((ulong)uVar24 >> 0x20);
          fStack_4dc = local_520._4_4_;
          uStack_518._0_4_ = (float)uVar25;
          fStack_4d8 = (float)uStack_518;
          uStack_518._4_4_ = (float)((ulong)uVar25 >> 0x20);
          fStack_4d4 = uStack_518._4_4_;
          uStack_510._0_4_ = (float)uVar26;
          fStack_4d0 = (float)uStack_510;
          uStack_510._4_4_ = (float)((ulong)uVar26 >> 0x20);
          fStack_4cc = uStack_510._4_4_;
          uStack_508._0_4_ = (float)uVar27;
          fStack_4c8 = (float)uStack_508;
          uStack_508._4_4_ = (float)((ulong)uVar27 >> 0x20);
          fStack_4c4 = uStack_508._4_4_;
          local_500 = local_260._0_8_;
          uStack_4f8 = local_260._8_8_;
          uStack_4f0 = local_260._16_8_;
          uStack_4e8 = local_260._24_8_;
          local_100 = (float)local_520 * (float)local_460;
          fStack_fc = local_520._4_4_ * local_460._4_4_;
          fStack_f8 = (float)uStack_518 * (float)uStack_458;
          fStack_f4 = uStack_518._4_4_ * uStack_458._4_4_;
          fStack_f0 = (float)uStack_510 * (float)uStack_450;
          fStack_ec = uStack_510._4_4_ * uStack_450._4_4_;
          fStack_e8 = (float)uStack_508 * (float)uStack_448;
          local_120 = local_bc0;
          uStack_118 = uStack_bb8;
          uStack_110 = uStack_bb0;
          uStack_108 = uStack_ba8;
          local_7c0 = CONCAT44(fStack_fc + local_6a0._4_4_ * local_680._4_4_,
                               local_100 + (float)local_6a0 * (float)local_680);
          uStack_7b8 = CONCAT44(fStack_f4 + uStack_698._4_4_ * uStack_678._4_4_,
                                fStack_f8 + (float)uStack_698 * (float)uStack_678);
          uStack_7b0 = CONCAT44(fStack_ec + uStack_690._4_4_ * uStack_670._4_4_,
                                fStack_f0 + (float)uStack_690 * (float)uStack_670);
          uStack_7a8 = CONCAT44(uStack_508._4_4_ + uStack_688._4_4_,
                                fStack_e8 + (float)uStack_688 * (float)uStack_668);
          local_748 = (undefined8 *)((long)local_980 + (long)(local_aac << 3) * 4);
          *local_748 = local_780;
          local_748[1] = uStack_778;
          local_748[2] = uStack_770;
          local_748[3] = uStack_768;
          local_788 = (undefined8 *)((long)local_988 + (long)(local_aac << 3) * 4);
          *local_788 = local_7c0;
          local_788[1] = uStack_7b8;
          local_788[2] = uStack_7b0;
          local_788[3] = uStack_7a8;
          local_a98 = local_a98 + 2;
          local_6a0 = uVar20;
          uStack_698 = uVar21;
          uStack_690 = uVar22;
          uStack_688 = uVar23;
          local_680 = local_2a0._0_8_;
          uStack_678 = local_2a0._8_8_;
          uStack_670 = local_2a0._16_8_;
          uStack_668 = local_2a0._24_8_;
          local_660 = uVar12;
          uStack_658 = uVar13;
          uStack_650 = uVar14;
          uStack_648 = uVar15;
          local_520 = uVar24;
          uStack_518 = uVar25;
          uStack_510 = uVar26;
          uStack_508 = uVar27;
          local_480 = uVar16;
          uStack_478 = uVar17;
          uStack_470 = uVar18;
          uStack_468 = uVar19;
          local_460 = local_260._0_8_;
          uStack_458 = local_260._8_8_;
          uStack_450 = local_260._16_8_;
          uStack_448 = local_260._24_8_;
          local_2a0 = auVar32;
          local_280 = local_70c;
          local_27c = local_70c;
          local_278 = local_70c;
          local_274 = local_70c;
          local_270 = local_70c;
          local_26c = local_70c;
          local_268 = local_70c;
          local_264 = local_70c;
          local_260 = auVar33;
          local_240 = local_710;
          local_23c = local_710;
          local_238 = local_710;
          local_234 = local_710;
          local_230 = local_710;
          local_22c = local_710;
          local_228 = local_710;
          local_224 = local_710;
          fStack_124 = fStack_424;
          fStack_e4 = fStack_4c4;
        }
      }
    }
    local_714 = *local_8c8;
    auVar8 = vinsertps_avx(ZEXT416(local_714),ZEXT416(local_714),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(local_714),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416(local_714),0x30);
    auVar9 = vinsertps_avx(ZEXT416(local_714),ZEXT416(local_714),0x10);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(local_714),0x20);
    auVar9 = vinsertps_avx(auVar9,ZEXT416(local_714),0x30);
    auVar34._16_16_ = auVar8;
    auVar34._0_16_ = auVar9;
    local_220._0_8_ = auVar9._0_8_;
    local_220._8_8_ = auVar9._8_8_;
    local_220._16_8_ = auVar8._0_8_;
    local_220._24_8_ = auVar8._8_8_;
    local_718 = local_8c8[1];
    auVar10 = vinsertps_avx(ZEXT416(local_718),ZEXT416(local_718),0x10);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(local_718),0x20);
    auVar10 = vinsertps_avx(auVar10,ZEXT416(local_718),0x30);
    auVar11 = vinsertps_avx(ZEXT416(local_718),ZEXT416(local_718),0x10);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(local_718),0x20);
    auVar11 = vinsertps_avx(auVar11,ZEXT416(local_718),0x30);
    auVar35._16_16_ = auVar10;
    auVar35._0_16_ = auVar11;
    local_1e0._0_8_ = auVar11._0_8_;
    local_1e0._8_8_ = auVar11._8_8_;
    local_1e0._16_8_ = auVar10._0_8_;
    local_1e0._24_8_ = auVar10._8_8_;
    local_c08 = local_980;
    local_c10 = local_988;
    local_808 = local_8b0;
    local_80c = local_990;
    local_c18 = (undefined8 *)
                (*local_8b0 +
                (long)*(int *)((long)local_8b0 + 0x2c) * (long)local_990 * local_8b0[2]);
    for (local_c1c = 0; local_c1c < local_8d4; local_c1c = local_c1c + 1) {
      local_898 = local_c08;
      uVar12 = *local_c08;
      uVar13 = local_c08[1];
      uVar14 = local_c08[2];
      uVar15 = local_c08[3];
      local_8a0 = local_c10;
      uVar16 = *local_c10;
      uVar17 = local_c10[1];
      uVar18 = local_c10[2];
      uVar19 = local_c10[3];
      local_6e0._0_4_ = (float)uVar12;
      local_6e0._4_4_ = (float)((ulong)uVar12 >> 0x20);
      uStack_6d8._0_4_ = (float)uVar13;
      uStack_6d8._4_4_ = (float)((ulong)uVar13 >> 0x20);
      uStack_6d0._0_4_ = (float)uVar14;
      uStack_6d0._4_4_ = (float)((ulong)uVar14 >> 0x20);
      uStack_6c8._0_4_ = (float)uVar15;
      uStack_6c8._4_4_ = (float)((ulong)uVar15 >> 0x20);
      local_700._0_4_ = auVar9._0_4_;
      local_700._4_4_ = auVar9._4_4_;
      uStack_6f8._0_4_ = auVar9._8_4_;
      uStack_6f8._4_4_ = auVar9._12_4_;
      uStack_6f0._0_4_ = auVar8._0_4_;
      uStack_6f0._4_4_ = auVar8._4_4_;
      uStack_6e8._0_4_ = auVar8._8_4_;
      local_c80 = CONCAT44(local_6e0._4_4_ * local_700._4_4_,(float)local_6e0 * (float)local_700);
      uStack_c78 = CONCAT44(uStack_6d8._4_4_ * uStack_6f8._4_4_,
                            (float)uStack_6d8 * (float)uStack_6f8);
      uStack_c70 = CONCAT44(uStack_6d0._4_4_ * uStack_6f0._4_4_,
                            (float)uStack_6d0 * (float)uStack_6f0);
      uStack_c68 = CONCAT44(uStack_6c8._4_4_,(float)uStack_6c8 * (float)uStack_6e8);
      local_5e0 = local_1e0._0_8_;
      uStack_5d8 = local_1e0._8_8_;
      uStack_5d0 = local_1e0._16_8_;
      uStack_5c8 = local_1e0._24_8_;
      local_600 = local_c80;
      uStack_5f8 = uStack_c78;
      uStack_5f0 = uStack_c70;
      uStack_5e8 = uStack_c68;
      local_5c0._0_4_ = (float)uVar16;
      local_580 = (float)local_5c0;
      local_5c0._4_4_ = (float)((ulong)uVar16 >> 0x20);
      fStack_57c = local_5c0._4_4_;
      uStack_5b8._0_4_ = (float)uVar17;
      fStack_578 = (float)uStack_5b8;
      uStack_5b8._4_4_ = (float)((ulong)uVar17 >> 0x20);
      fStack_574 = uStack_5b8._4_4_;
      uStack_5b0._0_4_ = (float)uVar18;
      fStack_570 = (float)uStack_5b0;
      uStack_5b0._4_4_ = (float)((ulong)uVar18 >> 0x20);
      fStack_56c = uStack_5b0._4_4_;
      uStack_5a8._0_4_ = (float)uVar19;
      fStack_568 = (float)uStack_5a8;
      uStack_5a8._4_4_ = (float)((ulong)uVar19 >> 0x20);
      fStack_564 = uStack_5a8._4_4_;
      local_5a0._0_4_ = auVar11._0_4_;
      local_5a0._4_4_ = auVar11._4_4_;
      uStack_598._0_4_ = auVar11._8_4_;
      uStack_598._4_4_ = auVar11._12_4_;
      uStack_590._0_4_ = auVar10._0_4_;
      uStack_590._4_4_ = auVar10._4_4_;
      uStack_588._0_4_ = auVar10._8_4_;
      local_c0 = (float)local_5c0 * (float)local_5a0;
      fStack_bc = local_5c0._4_4_ * local_5a0._4_4_;
      fStack_b8 = (float)uStack_5b8 * (float)uStack_598;
      fStack_b4 = uStack_5b8._4_4_ * uStack_598._4_4_;
      fStack_b0 = (float)uStack_5b0 * (float)uStack_590;
      fStack_ac = uStack_5b0._4_4_ * uStack_590._4_4_;
      fStack_a8 = (float)uStack_5a8 * (float)uStack_588;
      local_e0 = local_c80;
      uStack_d8 = uStack_c78;
      uStack_d0 = uStack_c70;
      uStack_c8 = uStack_c68;
      local_800 = CONCAT44(fStack_bc + local_6e0._4_4_ * local_700._4_4_,
                           local_c0 + (float)local_6e0 * (float)local_700);
      uStack_7f8 = CONCAT44(fStack_b4 + uStack_6d8._4_4_ * uStack_6f8._4_4_,
                            fStack_b8 + (float)uStack_6d8 * (float)uStack_6f8);
      uStack_7f0 = CONCAT44(fStack_ac + uStack_6d0._4_4_ * uStack_6f0._4_4_,
                            fStack_b0 + (float)uStack_6d0 * (float)uStack_6f0);
      uStack_7e8 = CONCAT44(uStack_5a8._4_4_ + uStack_6c8._4_4_,
                            fStack_a8 + (float)uStack_6c8 * (float)uStack_6e8);
      local_7c8 = local_c18;
      *local_c18 = local_800;
      local_c18[1] = uStack_7f8;
      local_c18[2] = uStack_7f0;
      local_c18[3] = uStack_7e8;
      local_c18 = local_c18 + 4;
      local_c08 = local_c08 + 4;
      local_c10 = local_c10 + 4;
      local_700 = local_220._0_8_;
      uStack_6f8 = local_220._8_8_;
      uStack_6f0 = local_220._16_8_;
      uStack_6e8 = local_220._24_8_;
      local_6e0 = uVar12;
      uStack_6d8 = uVar13;
      uStack_6d0 = uVar14;
      uStack_6c8 = uVar15;
      local_5c0 = uVar16;
      uStack_5b8 = uVar17;
      uStack_5b0 = uVar18;
      uStack_5a8 = uVar19;
      local_5a0 = local_1e0._0_8_;
      uStack_598 = local_1e0._8_8_;
      uStack_590 = local_1e0._16_8_;
      uStack_588 = local_1e0._24_8_;
      fStack_a4 = fStack_564;
    }
    local_8c8 = local_8c8 + 2;
    local_98c = iVar1;
    local_220 = auVar34;
    local_200 = local_714;
    local_1fc = local_714;
    local_1f8 = local_714;
    local_1f4 = local_714;
    local_1f0 = local_714;
    local_1ec = local_714;
    local_1e8 = local_714;
    local_1e4 = local_714;
    local_1e0 = auVar35;
    local_1c0 = local_718;
    local_1bc = local_718;
    local_1b8 = local_718;
    local_1b4 = local_718;
    local_1b0 = local_718;
    local_1ac = local_718;
    local_1a8 = local_718;
    local_1a4 = local_718;
  }
  ppuVar36 = &local_968;
  local_860 = ppuVar36;
  local_348 = ppuVar36;
  if (local_960 != (int *)0x0) {
    local_34c = 0xffffffff;
    LOCK();
    local_350 = *local_960;
    *local_960 = *local_960 + -1;
    UNLOCK();
    if (local_350 == 1) {
      if (local_948 == (long *)0x0) {
        local_340 = local_968;
        if (local_968 != (undefined8 *)0x0) {
          free(local_968);
        }
      }
      else {
        (**(code **)(*local_948 + 0x18))(local_948,local_968);
      }
    }
  }
  *ppuVar36 = (undefined8 *)0x0;
  ppuVar36[2] = (undefined8 *)0x0;
  *(undefined4 *)(ppuVar36 + 3) = 0;
  *(undefined4 *)(ppuVar36 + 5) = 0;
  *(undefined4 *)((long)ppuVar36 + 0x2c) = 0;
  *(undefined4 *)(ppuVar36 + 6) = 0;
  *(undefined4 *)((long)ppuVar36 + 0x34) = 0;
  *(undefined4 *)(ppuVar36 + 7) = 0;
  ppuVar36[8] = (undefined8 *)0x0;
  ppuVar36[1] = (undefined8 *)0x0;
  local_850 = &local_920;
  if (local_918 != (int *)0x0) {
    local_36c = 0xffffffff;
    LOCK();
    local_370 = *local_918;
    *local_918 = *local_918 + -1;
    UNLOCK();
    if (local_370 == 1) {
      local_368 = local_850;
      if (local_900 == (long *)0x0) {
        local_330 = local_920;
        if (local_920 != (undefined8 *)0x0) {
          free(local_920);
        }
      }
      else {
        (**(code **)(*local_900 + 0x18))(local_900,local_920);
      }
    }
  }
  return;
}

Assistant:

static void resize_bilinear_image_pack8(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w, (size_t)8 * 4u, 8);
    Mat rowsbuf1(w, (size_t)8 * 4u, 8);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -2;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S1p = S1 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);

                __m256 _S10 = _mm256_load_ps(S1p);
                __m256 _S11 = _mm256_load_ps(S1p + 8);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm256_store_ps(rows1p + dx * 8, _rows1);

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy + 1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
            for (; dx < w; dx++)
            {
                int sx = xofs[dx] * 8;
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                __m256 _a0 = _mm256_set1_ps(alphap[0]);
                __m256 _a1 = _mm256_set1_ps(alphap[1]);

                __m256 _S00 = _mm256_load_ps(S0p);
                __m256 _S01 = _mm256_load_ps(S0p + 8);
                __m256 _S10 = _mm256_load_ps(S1p);
                __m256 _S11 = _mm256_load_ps(S1p + 8);
                __m256 _rows0 = _mm256_mul_ps(_S00, _a0);
                __m256 _rows1 = _mm256_mul_ps(_S10, _a0);
                _rows0 = _mm256_comp_fmadd_ps(_S01, _a1, _rows0);
                _rows1 = _mm256_comp_fmadd_ps(_S11, _a1, _rows1);
                _mm256_store_ps(rows0p + dx * 8, _rows0);
                _mm256_store_ps(rows1p + dx * 8, _rows1);

                alphap += 2;
            }
        }

        prev_sy1 = sy;

        // vresize
        __m256 _b0 = _mm256_set1_ps(beta[0]);
        __m256 _b1 = _mm256_set1_ps(beta[1]);

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

        for (int dx = 0; dx < w; dx++)
        {
            __m256 _rows0 = _mm256_load_ps(rows0p);
            __m256 _rows1 = _mm256_load_ps(rows1p);
            __m256 _D = _mm256_mul_ps(_rows0, _b0);
            _D = _mm256_comp_fmadd_ps(_rows1, _b1, _D);
            _mm256_store_ps(Dp, _D);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }

        beta += 2;
    }
}